

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::got_none::~got_none(got_none *this)

{
  got_none *this_local;
  
  ~got_none(this);
  operator_delete(this);
  return;
}

Assistant:

got_none( location where_, text expr_)
    : success( "passed: got no exception", where_, expr_) {}